

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall
ninx::parser::Parser::parse_sub_expression
          (Parser *this,
          function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
          *term_parser,
          vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
          *operators)

{
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> _Var1;
  int iVar2;
  undefined8 uVar3;
  long *in_RCX;
  _func_int **unaff_RBX;
  string *sequence;
  string *psVar4;
  ulong uVar5;
  long *local_60;
  _func_int **local_58;
  long *local_50;
  _func_int **local_48;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_40;
  _func_int **local_38;
  
  local_40._M_head_impl = (Expression *)this;
  if ((operators->
      super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    std::__throw_bad_function_call();
LAB_001498bd:
    std::__throw_bad_function_call();
LAB_001498c2:
    uVar3 = std::__throw_bad_function_call();
    if (local_48 != (_func_int **)0x0) {
      (**(code **)(*local_48 + 8))();
    }
    if (unaff_RBX != (_func_int **)0x0) {
      (**(code **)(*unaff_RBX + 8))(unaff_RBX);
    }
    _Unwind_Resume(uVar3);
  }
  (*(code *)operators[1].
            super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
            ._M_impl.super__Vector_impl_data._M_start)(&local_48,operators);
  unaff_RBX = local_48;
  local_48 = (_func_int **)0x0;
  sequence = (string *)*in_RCX;
  psVar4 = (string *)in_RCX[1];
  if (sequence != psVar4) {
    do {
      iVar2 = TokenReader::check_limiter_sequence((TokenReader *)(term_parser + 1),sequence);
      if (iVar2 == 1) {
        if (sequence->_M_string_length != 0) {
          uVar5 = 0;
          do {
            TokenReader::get_token((TokenReader *)(term_parser + 1));
            uVar5 = uVar5 + 1;
          } while (uVar5 < sequence->_M_string_length);
        }
        if ((operators->
            super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) goto LAB_001498c2;
        (*(code *)operators[1].
                  super__Vector_base<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start)(&local_50,operators);
        local_60 = local_50;
        local_50 = (long *)0x0;
        local_58 = unaff_RBX;
        if (sequence[1].field_2._M_allocated_capacity == 0) goto LAB_001498bd;
        (**(code **)((long)&sequence[1].field_2 + 8))(&local_38,sequence + 1,&local_58,&local_60);
        if (local_60 != (long *)0x0) {
          (**(code **)(*local_60 + 8))();
        }
        local_60 = (long *)0x0;
        if (local_58 != (_func_int **)0x0) {
          (**(code **)(*local_58 + 8))();
        }
        unaff_RBX = local_38;
        local_58 = (_func_int **)0x0;
        if (local_50 != (long *)0x0) {
          (**(code **)(*local_50 + 8))();
        }
        sequence = (string *)*in_RCX;
        psVar4 = (string *)in_RCX[1];
      }
      else {
        sequence = sequence + 2;
      }
    } while (sequence != psVar4);
  }
  _Var1._M_head_impl = local_40._M_head_impl;
  ((local_40._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement = unaff_RBX;
  if (local_48 != (_func_int **)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )_Var1._M_head_impl;
}

Assistant:

std::unique_ptr<Expression>
ninx::parser::Parser::parse_sub_expression(std::function<std::unique_ptr<Expression>()> term_parser,
                                           std::vector<ninx::parser::OperatorCaseDefinition> operators) {
    std::unique_ptr<Expression> expression{nullptr};

    auto first{term_parser()};
    expression = std::move(first);

    while (true) {
        bool found{false};

        for (auto &case_def : operators) {
            if (reader.check_limiter_sequence(case_def.op) == 1) {
                // Remove the tokens
                for (int i = 0; i<case_def.op.length(); i++) {
                    reader.get_token();
                }

                auto second{term_parser()};

                auto sub_expr = case_def.builder(std::move(expression), std::move(second));
                expression = std::move(sub_expr);

                found = true;
                break;
            }
        }

        if (!found) {
            break;
        }
    }

    return std::move(expression);
}